

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O0

void __thiscall Assimp::XFile::Scene::~Scene(Scene *this)

{
  Node *this_00;
  Mesh *this_01;
  Animation *this_02;
  size_type sVar1;
  reference ppMVar2;
  reference ppAVar3;
  uint local_18;
  uint local_14;
  uint a_1;
  uint a;
  Scene *this_local;
  
  this_00 = this->mRootNode;
  if (this_00 != (Node *)0x0) {
    XFile::Node::~Node(this_00);
    operator_delete(this_00);
  }
  this->mRootNode = (Node *)0x0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::size
                      (&this->mGlobalMeshes);
    if (sVar1 <= local_14) break;
    ppMVar2 = std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::operator[]
                        (&this->mGlobalMeshes,(ulong)local_14);
    this_01 = *ppMVar2;
    if (this_01 != (Mesh *)0x0) {
      XFile::Mesh::~Mesh(this_01);
      operator_delete(this_01);
    }
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::
            size(&this->mAnims);
    if (sVar1 <= local_18) break;
    ppAVar3 = std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::
              operator[](&this->mAnims,(ulong)local_18);
    this_02 = *ppAVar3;
    if (this_02 != (Animation *)0x0) {
      XFile::Animation::~Animation(this_02);
      operator_delete(this_02);
    }
    local_18 = local_18 + 1;
  }
  std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::~vector
            (&this->mAnims);
  std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::~vector
            (&this->mGlobalMaterials);
  std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::~vector
            (&this->mGlobalMeshes);
  return;
}

Assistant:

~Scene() {
        delete mRootNode;
        mRootNode = nullptr;
        for (unsigned int a = 0; a < mGlobalMeshes.size(); ++a ) {
            delete mGlobalMeshes[a];
        }
        for (unsigned int a = 0; a < mAnims.size(); ++a ) {
            delete mAnims[a];
        }
    }